

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O2

void PackedArray_set(PackedArray *a,uint32_t offset,uint32_t in)

{
  uint uVar1;
  sbyte sVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (a == (PackedArray *)0x0) {
    __assert_fail("a != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                  ,0x1fc,"void PackedArray_set(PackedArray *, const uint32_t, const uint32_t)");
  }
  uVar7 = a->bitsPerItem;
  uVar5 = (int)(1L << ((byte)uVar7 & 0x3f)) - 1;
  if (in <= uVar5) {
    uVar6 = (ulong)offset * (ulong)uVar7 >> 5;
    uVar1 = (uint)((ulong)offset * (ulong)uVar7) & 0x1f;
    uVar4 = 0x20 - uVar1;
    sVar2 = (sbyte)uVar1;
    if (uVar4 < uVar7) {
      bVar3 = (byte)uVar4;
      uVar7 = ~(uVar5 << sVar2) & a[1].padding[uVar6 - 2] | in << sVar2;
      a[1].padding[uVar6 - 1] =
           ~(uVar5 >> (bVar3 & 0x1f)) & a[1].padding[uVar6 - 1] | in >> (bVar3 & 0x1f);
    }
    else {
      uVar7 = in << sVar2 | ~(uVar5 << sVar2) & a[1].padding[uVar6 - 2];
    }
    a[1].padding[uVar6 - 2] = uVar7;
    return;
  }
  __assert_fail("0 == (~mask & in)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                ,0x206,"void PackedArray_set(PackedArray *, const uint32_t, const uint32_t)");
}

Assistant:

void PackedArray_set(PackedArray* a, const uint32_t offset, const uint32_t in)
{
  uint32_t* __restrict out;
  uint32_t bitsPerItem;
  uint32_t startBit;
  uint32_t bitsAvailable;
  uint32_t mask;

  PACKEDARRAY_ASSERT(a != NULL);

  bitsPerItem = a->bitsPerItem;

  out = &a->buffer[((uint64_t)offset * (uint64_t)bitsPerItem) / 32];
  startBit = ((uint64_t)offset * (uint64_t)bitsPerItem) % 32;

  bitsAvailable = 32 - startBit;

  mask = (uint32_t)(1ULL << bitsPerItem) - 1;
  PACKEDARRAY_ASSERT(0 == (~mask & in));

  if (bitsPerItem <= bitsAvailable)
  {
    out[0] = (out[0] & ~(mask << startBit)) | (in << startBit);
  }
  else
  {
    // value spans 2 buffer cells
    uint32_t low, high;

    low = in << startBit;
    high = in >> bitsAvailable;

    out[0] = (out[0] & ~(mask << startBit)) | low;

    out[1] = (out[1] & ~(mask >> (32 - startBit))) | high;
  }
}